

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O1

CodeWord ZXing::Pdf417::ReadCodeWord<ZXing::PointT<double>>
                   (BitMatrixCursor<ZXing::PointT<double>_> *cur,int expectedCluster)

{
  byte bVar1;
  BitMatrix *pBVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  PointT<double> PVar7;
  int i;
  long lVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  array<int,_8UL> *__return_storage_ptr__;
  uint uVar12;
  char cVar13;
  undefined4 uVar14;
  uint uVar16;
  uint uVar17;
  undefined1 auVar15 [16];
  array<int,_8UL> np;
  array<int,_8UL> np_1;
  undefined1 local_c8 [8];
  undefined1 auStack_c0 [16];
  undefined1 auStack_b0 [16];
  array<int,_8UL> local_a0;
  _Type local_80;
  undefined1 local_70 [16];
  undefined8 local_60;
  undefined8 uStack_58;
  double local_50;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  double local_38;
  
  pBVar2 = cur->img;
  dVar5 = (cur->p).x;
  dVar6 = (cur->p).y;
  dVar3 = (cur->d).x;
  dVar4 = (cur->d).y;
  PVar7 = cur->d;
  uVar12 = 0;
  local_70 = (undefined1  [16])
             BitMatrixCursor<ZXing::PointT<double>>::readPattern<std::array<unsigned_short,8ul>>
                       ((BitMatrixCursor<ZXing::PointT<double>> *)cur,0);
  local_a0._M_elems._0_8_ = local_70;
  local_a0._M_elems[2] = 8;
  local_a0._M_elems[4] = 0;
  local_a0._M_elems[5] = 0;
  local_a0._M_elems[6] = 0;
  local_a0._M_elems[7] = 0;
  __return_storage_ptr__ = (array<int,_8UL> *)local_c8;
  NormalizedPattern<8,17>(__return_storage_ptr__,(ZXing *)&local_a0,local_70._8_8_);
  uVar10 = (((local_c8._0_4_ + auStack_c0._8_4_) - (auStack_c0._0_4_ + auStack_b0._0_4_)) + 9) % 9;
  if ((expectedCluster == -1) || (uVar11 = 0xffffffff, uVar10 == expectedCluster)) {
    lVar8 = 0;
    do {
      uVar11 = ~(uint)lVar8 & 1;
      uVar12 = (uVar11 << (local_c8[lVar8 * 4] & 0x1f)) - uVar11 |
               uVar12 << (local_c8[lVar8 * 4] & 0x1f);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    uVar11 = CodewordDecoder::GetCodeword(uVar12);
  }
  uVar12 = uVar11;
  if (uVar11 == 0xffffffff) {
    uVar16 = (uint)((ulong)dVar3 >> 0x20);
    uVar17 = (uint)((ulong)dVar4 >> 0x20);
    local_50 = dVar4;
    local_48 = SUB84(dVar3,0);
    uStack_44 = uVar16 ^ 0x80000000;
    uStack_40 = SUB84(dVar4,0);
    uStack_3c = uVar17 ^ 0x80000000;
    local_38 = dVar3;
    uVar14 = SUB84(dVar4,0);
    if (ABS(dVar4) <= ABS(dVar3)) {
      uVar14 = SUB84(dVar3,0);
      uVar17 = uVar16;
    }
    auVar15._8_4_ = uVar14;
    auVar15._0_8_ = CONCAT44(uVar17,uVar14) & 0x7fffffffffffffff;
    auVar15._12_4_ = uVar17 & 0x7fffffff;
    auVar15 = divpd((undefined1  [16])PVar7,auVar15);
    lVar8 = 0;
    do {
      local_c8 = (undefined1  [8])pBVar2;
      dVar3 = *(double *)((long)&local_50 + lVar8) + dVar5;
      dVar4 = *(double *)((long)&local_48 + lVar8) + dVar6;
      auStack_c0._8_4_ = SUB84(dVar4,0);
      auStack_c0._0_8_ = dVar3;
      auStack_c0._12_4_ = (int)((ulong)dVar4 >> 0x20);
      auStack_b0 = auVar15;
      cVar13 = '\x03';
      if ((((0.0 <= dVar3) && (dVar3 < (double)pBVar2->_width)) && (0.0 <= dVar4)) &&
         (dVar4 < (double)pBVar2->_height)) {
        local_80 = (_Type)BitMatrixCursor<ZXing::PointT<double>>::
                          readPattern<std::array<unsigned_short,8ul>>
                                    ((BitMatrixCursor<ZXing::PointT<double>> *)local_c8,0);
        local_70._8_4_ = 8;
        local_70._0_8_ = local_80;
        local_60 = 0;
        uStack_58 = 0;
        NormalizedPattern<8,17>(&local_a0,(ZXing *)local_70,local_80._8_8_);
        uVar17 = (((local_a0._M_elems[0] + local_a0._M_elems[4]) -
                  (local_a0._M_elems[2] + local_a0._M_elems[6])) + 9) % 9;
        __return_storage_ptr__ = (array<int,_8UL> *)(ulong)uVar17;
        if ((expectedCluster == -1) || (uVar12 = 0xffffffff, uVar17 == expectedCluster)) {
          lVar9 = 0;
          uVar12 = 0;
          do {
            bVar1 = (byte)local_a0._M_elems[lVar9];
            uVar17 = ~(uint)lVar9 & 1;
            uVar12 = (uVar17 << (bVar1 & 0x1f)) - uVar17 | uVar12 << (bVar1 & 0x1f);
            lVar9 = lVar9 + 1;
          } while (lVar9 != 8);
          uVar12 = CodewordDecoder::GetCodeword(uVar12);
        }
        cVar13 = uVar12 != 0xffffffff;
        if ((bool)cVar13) {
          (cur->d).y = (double)auStack_b0._8_8_;
          (cur->p).y = (double)auStack_c0._8_8_;
          (cur->d).x = (double)auStack_b0._0_8_;
          cur->img = (BitMatrix *)local_c8;
          (cur->p).x = (double)auStack_c0._0_8_;
        }
      }
      if ((cVar13 != '\x03') && (cVar13 != '\0')) goto LAB_001779be;
      lVar8 = lVar8 + 0x10;
    } while (lVar8 != 0x20);
    __return_storage_ptr__ = (array<int,_8UL> *)(ulong)uVar10;
    uVar12 = uVar11;
  }
  else {
    __return_storage_ptr__ = (array<int,_8UL> *)(ulong)uVar10;
  }
LAB_001779be:
  return (CodeWord)((ulong)__return_storage_ptr__ & 0xffffffff | (ulong)uVar12 << 0x20);
}

Assistant:

CodeWord ReadCodeWord(BitMatrixCursor<POINT>& cur, int expectedCluster = -1)
{
	auto readCodeWord = [expectedCluster](auto& cur) -> CodeWord {
		auto np     = NormalizedPattern<8, 17>(cur.template readPattern<Pattern417>());
		int cluster = (np[0] - np[2] + np[4] - np[6] + 9) % 9;
		int code = expectedCluster == -1 || cluster == expectedCluster ? CodewordDecoder::GetCodeword(ToInt(np)) : -1;

		return {cluster, code};
	};

	auto curBackup = cur;
	auto cw = readCodeWord(cur);
	if (!cw) {
		for (auto offset : {curBackup.left(), curBackup.right()}) {
			auto curAlt = curBackup.movedBy(offset);
			if (!curAlt.isIn()) // curBackup might be the first or last image row
				continue;
			if (auto cwAlt = readCodeWord(curAlt)) {
				cur = curAlt;
				return cwAlt;
			}
		}
	}
	return cw;
}